

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::verifyImage
          (TestStatus *__return_storage_ptr__,PushConstantGraphicsTestInstance *this)

{
  TextureFormat *this_00;
  undefined4 queueFamilyIndex_00;
  ulong uVar1;
  uint surfaceWidth;
  uint surfaceHeight;
  size_type sVar2;
  reference pvVar3;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_00;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)9> *pHVar4;
  TestContext *this_01;
  TestLog *log;
  TextureLevel *this_02;
  allocator<char> local_891;
  string local_890;
  undefined4 local_870;
  allocator<char> local_869;
  string local_868;
  Vector<int,_3> local_844;
  Vector<unsigned_int,_4> local_838;
  ConstPixelBufferAccess local_828;
  ConstPixelBufferAccess local_800;
  deUint64 local_7d8;
  undefined1 local_7d0 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  undefined1 local_5b8 [8];
  SimpleAllocator allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_370;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_368;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_360;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_358;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_350;
  ViewportState local_338;
  undefined1 local_320 [8];
  RenderState renderState;
  int triangleNdx;
  Vector<float,_3> local_21c;
  ulong local_210;
  size_t vertexNdx_2;
  Vector<float,_3> local_1ec;
  ulong local_1e0;
  size_t vertexNdx_1;
  Vector<float,_4> local_1c0;
  ulong local_1b0;
  size_t vertexNdx;
  size_t rangeNdx;
  byte local_181;
  undefined1 local_180 [7];
  bool compareOk;
  ReferenceRenderer refRenderer;
  Program program;
  undefined1 local_a8 [8];
  ColorFragmentShader fragmentShader;
  ColorVertexShader vertexShader;
  TextureFormat tcuDepthFormat;
  TextureFormat tcuColorFormat;
  PushConstantGraphicsTestInstance *this_local;
  
  tcuDepthFormat = ::vk::mapVkFormat(this->m_colorFormat);
  this_00 = (TextureFormat *)
            &vertexShader.super_VertexShader.m_outputs.
             super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  tcu::TextureFormat::TextureFormat(this_00);
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  ColorFragmentShader::ColorFragmentShader((ColorFragmentShader *)local_a8,&tcuDepthFormat,this_00);
  rr::Program::Program
            ((Program *)&refRenderer.m_program,(VertexShader *)&fragmentShader.m_depthStencilFormat,
             (FragmentShader *)local_a8,(GeometryShader *)0x0);
  surfaceWidth = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  surfaceHeight = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  ReferenceRenderer::ReferenceRenderer
            ((ReferenceRenderer *)local_180,surfaceWidth,surfaceHeight,1,&tcuDepthFormat,
             (TextureFormat *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Program *)&refRenderer.m_program);
  local_181 = 0;
  if ((this->m_shaderFlags & 8) != 0) {
    createQuad((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &rangeNdx,this,0.5);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
              (&this->m_vertices,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &rangeNdx);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &rangeNdx);
  }
  for (vertexNdx = 0; vertexNdx < this->m_rangeCount; vertexNdx = vertexNdx + 1) {
    if (this->m_pushConstantRange[vertexNdx].update.size <
        this->m_pushConstantRange[vertexNdx].range.size) {
      for (local_1b0 = 0; uVar1 = local_1b0,
          sVar2 = std::
                  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                  size(&this->m_vertices), uVar1 < sVar2; local_1b0 = local_1b0 + 1) {
        tcu::Vector<float,_4>::Vector(&local_1c0,1.0,1.0,1.0,1.0);
        pvVar3 = std::
                 vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                 operator[](&this->m_vertices,local_1b0);
        tcu::Vector<float,_4>::xyzw((VecAccess<float,_4,_4> *)&vertexNdx_1,&pvVar3->color);
        tcu::VecAccess<float,_4,_4>::operator=((VecAccess<float,_4,_4> *)&vertexNdx_1,&local_1c0);
      }
    }
  }
  if (this->m_multipleUpdate != 0) {
    for (local_1e0 = 0; local_1e0 < 3; local_1e0 = local_1e0 + 1) {
      tcu::Vector<float,_3>::Vector(&local_1ec,0.0,1.0,0.0);
      pvVar3 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ::operator[](&this->m_vertices,local_1e0);
      tcu::Vector<float,_4>::xyz((VecAccess<float,_4,_3> *)&vertexNdx_2,&pvVar3->color);
      tcu::VecAccess<float,_4,_3>::operator=((VecAccess<float,_4,_3> *)&vertexNdx_2,&local_1ec);
    }
    for (local_210 = 3; uVar1 = local_210,
        sVar2 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size(&this->m_vertices), uVar1 < sVar2; local_210 = local_210 + 1) {
      tcu::Vector<float,_3>::Vector(&local_21c,0.0,0.0,1.0);
      pvVar3 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ::operator[](&this->m_vertices,local_210);
      tcu::Vector<float,_4>::xyz
                ((VecAccess<float,_4,_3> *)&renderState.viewportOrientation,&pvVar3->color);
      tcu::VecAccess<float,_4,_3>::operator=
                ((VecAccess<float,_4,_3> *)&renderState.viewportOrientation,&local_21c);
    }
  }
  for (renderState.restart.restartIndex = 0; (int)renderState.restart.restartIndex < 2;
      renderState.restart.restartIndex = renderState.restart.restartIndex + 1) {
    ReferenceRenderer::getViewportState(&local_338,(ReferenceRenderer *)local_180);
    rr::RenderState::RenderState((RenderState *)local_320,&local_338,VIEWPORTORIENTATION_LOWER_LEFT)
    ;
    local_360._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   (&this->m_vertices);
    local_358 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_360,(long)(int)(renderState.restart.restartIndex * 3));
    local_370._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   (&this->m_vertices);
    local_368 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_370,(long)(int)(renderState.restart.restartIndex * 3 + 3));
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_350,local_358,local_368,
               (allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    ReferenceRenderer::draw
              ((ReferenceRenderer *)local_180,(RenderState *)local_320,PRIMITIVETYPE_TRIANGLES,
               &local_350);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_350);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
  }
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8,vk_01,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_5b8,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8);
  queueFamilyIndex_00 = allocator.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_7d8 = pHVar4->m_internal;
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_7d0,vk_00,device,queue_00,queueFamilyIndex_00,(Allocator *)local_5b8,
                      (VkImage)local_7d8,this->m_colorFormat,&this->m_renderSize);
  this_01 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_01);
  ReferenceRenderer::getAccess((PixelBufferAccess *)&local_800,(ReferenceRenderer *)local_180);
  this_02 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
            operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                       local_7d0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_828,this_02);
  tcu::Vector<unsigned_int,_4>::Vector(&local_838,2,2,2,2);
  tcu::Vector<int,_3>::Vector(&local_844,1,1,0);
  local_181 = tcu::intThresholdPositionDeviationCompare
                        (log,"IntImageCompare","Image comparison",&local_800,&local_828,&local_838,
                         &local_844,true,COMPARE_LOG_RESULT);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_7d0);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_5b8);
  if ((local_181 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"Image mismatch",&local_891);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_890);
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator(&local_891);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_868,"Result image matches reference",&local_869);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_868);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator(&local_869);
  }
  local_870 = 1;
  ReferenceRenderer::~ReferenceRenderer((ReferenceRenderer *)local_180);
  ColorFragmentShader::~ColorFragmentShader((ColorFragmentShader *)local_a8);
  ColorVertexShader::~ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus PushConstantGraphicsTestInstance::verifyImage (void)
{
	const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
	const tcu::TextureFormat	tcuDepthFormat	= tcu::TextureFormat();
	const ColorVertexShader		vertexShader;
	const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
	const rr::Program			program			(&vertexShader, &fragmentShader);
	ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
	bool						compareOk		= false;

	// Render reference image
	{
		if (m_shaderFlags & VK_SHADER_STAGE_GEOMETRY_BIT)
		{
			m_vertices = createQuad(0.5f);
		}

		for (size_t rangeNdx = 0; rangeNdx < m_rangeCount; rangeNdx++)
		{
			if (m_pushConstantRange[rangeNdx].update.size < m_pushConstantRange[rangeNdx].range.size)
			{
				for (size_t vertexNdx = 0; vertexNdx < m_vertices.size(); vertexNdx++)
				{
					m_vertices[vertexNdx].color.xyzw() = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				}
			}
		}

		if (m_multipleUpdate)
		{
			for (size_t vertexNdx = 0; vertexNdx < 3; vertexNdx++)
			{
				m_vertices[vertexNdx].color.xyz() = tcu::Vec3(0.0f, 1.0f, 0.0f);
			}
			for (size_t vertexNdx = 3; vertexNdx < m_vertices.size(); vertexNdx++)
			{
				m_vertices[vertexNdx].color.xyz() = tcu::Vec3(0.0f, 0.0f, 1.0f);
			}
		}

		for (int triangleNdx = 0; triangleNdx < TRIANGLE_COUNT; triangleNdx++)
		{
			rr::RenderState renderState(refRenderer.getViewportState());

			refRenderer.draw(renderState,
							 rr::PRIMITIVETYPE_TRIANGLES,
							 std::vector<Vertex4RGBA>(m_vertices.begin() + triangleNdx * 3,
													  m_vertices.begin() + (triangleNdx + 1) * 3));
		}
	}

	// Compare result with reference image
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					vkDevice			= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		SimpleAllocator					allocator			(vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));
		de::MovePtr<tcu::TextureLevel>	result				= readColorAttachment(vk, vkDevice, queue, queueFamilyIndex, allocator, *m_colorImage, m_colorFormat, m_renderSize);

		compareOk = tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
															  "IntImageCompare",
															  "Image comparison",
															  refRenderer.getAccess(),
															  result->getAccess(),
															  tcu::UVec4(2, 2, 2, 2),
															  tcu::IVec3(1, 1, 0),
															  true,
															  tcu::COMPARE_LOG_RESULT);
	}

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}